

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRuntimeOptions.h
# Opt level: O1

bool loadOptions(App *app,HighsLogOptions *report_log_options,HighsCommandLineOptions *c,
                HighsOptions *options)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  bool bVar5;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (c->cmd_version == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"HiGHS version ");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,1);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,10);
    poVar4 = std::operator<<(poVar4,".");
    std::ostream::operator<<((ostream *)poVar4,0);
    poVar4 = std::operator<<((ostream *)&std::cout," Githash ");
    poVar4 = std::operator<<(poVar4,"fd8665394");
    std::operator<<(poVar4,". ");
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)&kHighsCopyrightStatement_abi_cxx11_);
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(0);
  }
  iVar2 = std::__cxx11::string::compare((char *)&c->options_file);
  if (iVar2 != 0) {
    pcVar1 = (c->options_file)._M_dataplus._M_p;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + (c->options_file)._M_string_length);
    iVar2 = loadOptionsFromFile(report_log_options,options,(string *)local_90);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    if (iVar2 == -1) {
      return false;
    }
    if (iVar2 == 1) {
      writeOptionsToFile(_stdout,&(options->super_HighsOptionsStruct).log_options,
                         (vector *)&options->records,false,kFull);
      return false;
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)&c->cmd_presolve);
  if (iVar2 != 0) {
    pcVar1 = (c->cmd_presolve)._M_dataplus._M_p;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar1,pcVar1 + (c->cmd_presolve)._M_string_length);
    iVar2 = setLocalOptionValue(report_log_options,&kPresolveString_abi_cxx11_,
                                &(options->super_HighsOptionsStruct).log_options,&options->records,
                                (string *)local_b0);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if (iVar2 != 0) {
      return false;
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)&c->cmd_solver);
  if (iVar2 != 0) {
    pcVar1 = (c->cmd_solver)._M_dataplus._M_p;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar1,pcVar1 + (c->cmd_solver)._M_string_length);
    iVar2 = setLocalOptionValue(report_log_options,&kSolverString_abi_cxx11_,
                                &(options->super_HighsOptionsStruct).log_options,&options->records,
                                (string *)local_d0);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    if (iVar2 != 0) {
      return false;
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)&c->cmd_parallel);
  if (iVar2 != 0) {
    pcVar1 = (c->cmd_parallel)._M_dataplus._M_p;
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f0,pcVar1,pcVar1 + (c->cmd_parallel)._M_string_length);
    iVar2 = setLocalOptionValue(report_log_options,&kParallelString_abi_cxx11_,
                                &(options->super_HighsOptionsStruct).log_options,&options->records,
                                (string *)local_f0);
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0]);
    }
    if (iVar2 != 0) {
      return false;
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)&c->cmd_crossover);
  if (iVar2 != 0) {
    pcVar1 = (c->cmd_crossover)._M_dataplus._M_p;
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_110,pcVar1,pcVar1 + (c->cmd_crossover)._M_string_length);
    iVar2 = setLocalOptionValue(report_log_options,&kRunCrossoverString_abi_cxx11_,
                                &(options->super_HighsOptionsStruct).log_options,&options->records,
                                (string *)local_110);
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    if (iVar2 != 0) {
      return false;
    }
  }
  std::operator+(&local_50,"--",&kTimeLimitString_abi_cxx11_);
  sVar3 = CLI::App::count(app,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((sVar3 == 0) ||
     (iVar2 = setLocalOptionValue(report_log_options,(string *)&kTimeLimitString_abi_cxx11_,
                                  (vector *)&options->records,c->cmd_time_limit), iVar2 == 0)) {
    iVar2 = std::__cxx11::string::compare((char *)&c->cmd_solution_file);
    if (iVar2 != 0) {
      pcVar1 = (c->cmd_solution_file)._M_dataplus._M_p;
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_130,pcVar1,pcVar1 + (c->cmd_solution_file)._M_string_length);
      iVar2 = setLocalOptionValue(report_log_options,&kSolutionFileString_abi_cxx11_,
                                  &(options->super_HighsOptionsStruct).log_options,&options->records
                                  ,(string *)local_130);
      bVar5 = true;
      if (iVar2 == 0) {
        local_190[0] = local_180;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_190,"write_solution_to_file","");
        iVar2 = setLocalOptionValue(report_log_options,(string *)local_190,
                                    (vector *)&options->records,true);
        bVar5 = iVar2 != 0;
        if (local_190[0] != local_180) {
          operator_delete(local_190[0]);
        }
      }
      if (local_130[0] != local_120) {
        operator_delete(local_130[0]);
      }
      if (bVar5) {
        return false;
      }
    }
    iVar2 = std::__cxx11::string::compare((char *)&c->cmd_write_model_file);
    if (iVar2 != 0) {
      pcVar1 = (c->cmd_write_model_file)._M_dataplus._M_p;
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_150,pcVar1,pcVar1 + (c->cmd_write_model_file)._M_string_length);
      iVar2 = setLocalOptionValue(report_log_options,&kWriteModelFileString_abi_cxx11_,
                                  &(options->super_HighsOptionsStruct).log_options,&options->records
                                  ,(string *)local_150);
      bVar5 = true;
      if (iVar2 == 0) {
        local_1b0[0] = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"write_model_to_file","");
        iVar2 = setLocalOptionValue(report_log_options,(string *)local_1b0,
                                    (vector *)&options->records,true);
        bVar5 = iVar2 != 0;
        if (local_1b0[0] != local_1a0) {
          operator_delete(local_1b0[0]);
        }
      }
      if (local_150[0] != local_140) {
        operator_delete(local_150[0]);
      }
      if (bVar5) {
        return false;
      }
    }
    std::operator+(&local_70,"--",&kRandomSeedString_abi_cxx11_);
    sVar3 = CLI::App::count(app,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((sVar3 == 0) ||
       (iVar2 = setLocalOptionValue(report_log_options,(string *)&kRandomSeedString_abi_cxx11_,
                                    (vector *)&options->records,c->cmd_random_seed), iVar2 == 0)) {
      iVar2 = std::__cxx11::string::compare((char *)&c->cmd_ranging);
      if (iVar2 != 0) {
        pcVar1 = (c->cmd_ranging)._M_dataplus._M_p;
        local_170[0] = local_160;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_170,pcVar1,pcVar1 + (c->cmd_ranging)._M_string_length);
        iVar2 = setLocalOptionValue(report_log_options,&kRangingString_abi_cxx11_,
                                    &(options->super_HighsOptionsStruct).log_options,
                                    &options->records,(string *)local_170);
        if (local_170[0] != local_160) {
          operator_delete(local_170[0]);
        }
        if (iVar2 != 0) {
          return false;
        }
      }
      if ((c->model_file)._M_string_length != 0) {
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Please specify filename in .mps|.lp|.ems format.\n",0x31);
    }
  }
  return false;
}

Assistant:

bool loadOptions(const CLI::App& app, const HighsLogOptions& report_log_options,
                 const HighsCommandLineOptions& c, HighsOptions& options) {
  if (c.cmd_version) {
    std::cout << "HiGHS version " << HIGHS_VERSION_MAJOR << "."
              << HIGHS_VERSION_MINOR << "." << HIGHS_VERSION_PATCH;
    std::cout << " Githash " << HIGHS_GITHASH << ". ";
    std::cout << kHighsCopyrightStatement << std::endl;
    exit(0);
  }

  // Options file.
  if (c.options_file != "") {
    switch (loadOptionsFromFile(report_log_options, options, c.options_file)) {
      case HighsLoadOptionsStatus::kError:
        return false;
      case HighsLoadOptionsStatus::kEmpty:
        writeOptionsToFile(stdout, options.log_options, options.records);
        return false;
      default:
        break;
    }
  }
  // Handle command line option specifications.
  // Presolve option.
  if (c.cmd_presolve != "") {
    if (setLocalOptionValue(report_log_options, kPresolveString,
                            options.log_options, options.records,
                            c.cmd_presolve) != OptionStatus::kOk)
      return false;
  }

  // Solver option.
  if (c.cmd_solver != "") {
    if (setLocalOptionValue(report_log_options, kSolverString,
                            options.log_options, options.records,
                            c.cmd_solver) != OptionStatus::kOk)
      return false;
  }

  // Parallel option.
  if (c.cmd_parallel != "") {
    if (setLocalOptionValue(report_log_options, kParallelString,
                            options.log_options, options.records,
                            c.cmd_parallel) != OptionStatus::kOk)
      return false;
  }

  // Run crossover option.
  if (c.cmd_crossover != "") {
    if (setLocalOptionValue(report_log_options, kRunCrossoverString,
                            options.log_options, options.records,
                            c.cmd_crossover) != OptionStatus::kOk)
      return false;
  }

  // Time limit option.
  if (app.count("--" + kTimeLimitString) > 0) {
    if (setLocalOptionValue(report_log_options, kTimeLimitString,
                            options.records,
                            c.cmd_time_limit) != OptionStatus::kOk)
      return false;
  }

  // Solution file option.
  if (c.cmd_solution_file != "") {
    if (setLocalOptionValue(report_log_options, kSolutionFileString,
                            options.log_options, options.records,
                            c.cmd_solution_file) != OptionStatus::kOk ||
        setLocalOptionValue(report_log_options, "write_solution_to_file",
                            options.records, true) != OptionStatus::kOk)
      return false;
  }

  // Write model file option.
  if (c.cmd_write_model_file != "") {
    // std::cout << "Multiple write model files not implemented.\n";
    if (setLocalOptionValue(report_log_options, kWriteModelFileString,
                            options.log_options, options.records,
                            c.cmd_write_model_file) != OptionStatus::kOk ||
        setLocalOptionValue(report_log_options, "write_model_to_file",
                            options.records, true) != OptionStatus::kOk)
      return false;
  }

  // Random seed option.
  if (app.count("--" + kRandomSeedString) > 0) {
    HighsInt value = c.cmd_random_seed;
    if (setLocalOptionValue(report_log_options, kRandomSeedString,
                            options.records, value) != OptionStatus::kOk)
      return false;
  }

  // Ranging option.
  if (c.cmd_ranging != "") {
    if (setLocalOptionValue(report_log_options, kRangingString,
                            options.log_options, options.records,
                            c.cmd_ranging) != OptionStatus::kOk)
      return false;
  }

  // If this horrible hack is still needed, please add it to RunHighs.
  // model_file is now const in this method.

  // const bool horrible_hack_for_windows_visual_studio = false;
  // if (horrible_hack_for_windows_visual_studio) {
  //   // Until I know how to debug an executable using command line
  //   // arguments in Visual Studio on Windows, this is necessary!
  //   HighsInt random_seed = -3;
  //   if (random_seed >= 0) {
  //     if (setLocalOptionValue(report_log_options, kRandomSeedString,
  //                             options.records,
  //                             random_seed) != OptionStatus::kOk)
  //       return false;
  //   }
  //   model_file = "ml.mps";
  // }

  if (c.model_file.size() == 0) {
    std::cout << "Please specify filename in .mps|.lp|.ems format.\n";
    return false;
  }

  return true;
}